

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iso_surface.hpp
# Opt level: O1

void __thiscall
sisl::utility::isosurface::march_function
          (isosurface *this,function *f,double *isoValue,double *stepSize,vector *origin,
          vector *extent,bool flip_normal,function *dx,function *dy,function *dz)

{
  ply_mesh *this_00;
  double dVar1;
  double dVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  int iVar6;
  int iVar7;
  Index size;
  double *pdVar8;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *this_01;
  undefined8 *puVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  int iVar18;
  ulong uVar19;
  char cVar20;
  int iVar21;
  long lVar22;
  int iVar23;
  int *piVar24;
  ulong uVar25;
  ushort uVar26;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Da_04;
  undefined4 extraout_XMM0_Da_05;
  undefined4 extraout_XMM0_Da_06;
  undefined4 extraout_XMM0_Da_07;
  undefined4 extraout_XMM0_Da_08;
  undefined4 extraout_XMM0_Da_09;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Db_07;
  undefined4 extraout_XMM0_Db_08;
  undefined4 extraout_XMM0_Db_09;
  double dVar27;
  pointer ptVar28;
  undefined4 uVar29;
  double dVar30;
  vector x;
  pointer local_270;
  pointer local_260;
  pointer local_258;
  pointer local_250;
  pointer local_248;
  double local_240;
  double local_238;
  double local_230;
  double local_228;
  double local_220;
  pointer local_218;
  double local_210;
  double local_208;
  function *local_200;
  vector gv;
  double *local_1e8;
  double v010;
  double v001;
  double v110;
  double v100;
  int local_1a4;
  double v000;
  double v111;
  double v101;
  int local_180;
  undefined4 uStack_17c;
  double v011;
  int local_16c;
  int vertexIndexList [12];
  vector boundary;
  map<int,_sisl::vertex3,_std::less<int>,_std::allocator<std::pair<const_int,_sisl::vertex3>_>_>
  vMap;
  void *local_40 [2];
  
  lVar22 = (extent->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
  ;
  if (0 < lVar22) {
    pdVar8 = (extent->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data;
    if (*pdVar8 <= 0.0 && *pdVar8 != 0.0) {
LAB_00144cec:
      puVar9 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar9 = "Invalid extent for marching cubes!";
      __cxa_throw(puVar9,&char_const*::typeinfo,0);
    }
    if (lVar22 != 1) {
      if (pdVar8[1] <= 0.0 && pdVar8[1] != 0.0) goto LAB_00144cec;
      if (2 < lVar22) {
        if (pdVar8[2] <= 0.0 && pdVar8[2] != 0.0) goto LAB_00144cec;
        vMap._M_t._M_impl._0_8_ = origin;
        vMap._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = extent;
        if ((origin->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
            m_rows != lVar22) {
          __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                        "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,
                        "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::Matrix<double, -1, 1>]"
                       );
        }
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
        PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&boundary,
                   (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                    *)&vMap);
        lVar22 = (extent->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                 m_rows;
        if (((0 < lVar22) &&
            (dVar27 = floor(*(extent->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                             ).m_storage.m_data / *stepSize), lVar22 != 1)) && (2 < lVar22)) {
          iVar10 = (int)dVar27;
          vMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &vMap._M_t._M_impl.super__Rb_tree_header._M_header;
          vMap._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
               vMap._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
          vMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          vMap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_200 = f;
          vMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               vMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          if (0 < iVar10) {
            local_16c = iVar10 * 2;
            iVar21 = 0;
            do {
              lVar22 = (origin->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                       m_storage.m_rows;
              if (lVar22 < 1) goto LAB_00144baf;
              pdVar8 = (origin->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                       m_storage.m_data;
              v000 = 0.0;
              v001 = 0.0;
              v010 = 0.0;
              v100 = 0.0;
              v011 = 0.0;
              v110 = 0.0;
              v101 = 0.0;
              v111 = 0.0;
              if ((lVar22 == 1) ||
                 (boundary.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                  m_rows < 2)) goto LAB_00144baf;
              dVar27 = pdVar8[1];
              dVar30 = (double)(float)((double)iVar21 * *stepSize + *pdVar8);
              uVar17 = iVar21 * local_16c;
              iVar21 = iVar21 + 1;
              uVar11 = iVar21 * local_16c;
              iVar7 = 0;
              while (dVar27 = (double)(float)dVar27,
                    dVar27 < boundary.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                             .m_storage.m_data[1]) {
                if ((origin->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                    m_storage.m_rows < 3) goto LAB_00144baf;
                uVar29 = SUB84(dVar30,0);
                (*f->_vptr_function[2])
                          (uVar29,dVar27,
                           (origin->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                           m_storage.m_data[2],f);
                v000 = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
                if ((origin->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                    m_storage.m_rows < 3) goto LAB_00144baf;
                (*f->_vptr_function[2])
                          (SUB84(*stepSize + dVar30,0),dVar27,
                           (origin->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                           m_storage.m_data[2],f);
                v100 = (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00);
                if ((origin->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                    m_storage.m_rows < 3) goto LAB_00144baf;
                (*f->_vptr_function[2])
                          (SUB84(*stepSize + dVar30,0),*stepSize + dVar27,
                           (origin->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                           m_storage.m_data[2],f);
                v110 = (double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01);
                if ((origin->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                    m_storage.m_rows < 3) goto LAB_00144baf;
                (*f->_vptr_function[2])
                          (uVar29,*stepSize + dVar27,
                           (origin->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                           m_storage.m_data[2],f);
                v010 = (double)CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02);
                if (((origin->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                     m_storage.m_rows < 3) ||
                   (boundary.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                    m_storage.m_rows < 3)) goto LAB_00144baf;
                dVar1 = *isoValue;
                dVar2 = (origin->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                        m_storage.m_data[2];
                uVar19 = (ulong)((uint)(v000 < dVar1) << 4 |
                                (uint)((double)CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02) <=
                                       dVar1 && dVar1 != (double)CONCAT44(extraout_XMM0_Db_02,
                                                                          extraout_XMM0_Da_02)) << 7
                                | (uint)(v100 < dVar1) << 5 | (uint)(v110 < dVar1) << 6);
                iVar12 = ((uVar17 | 1) + iVar7) * local_16c;
                iVar13 = ((uVar11 | 1) + iVar7) * local_16c;
                iVar14 = (uVar11 + iVar7) * local_16c;
                iVar15 = (uVar17 + iVar7) * local_16c;
                iVar23 = 0;
                while( true ) {
                  ptVar28 = (pointer)(double)(float)dVar2;
                  if (boundary.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                      m_storage.m_data[2] <= (double)ptVar28) break;
                  (*f->_vptr_function[2])(uVar29,dVar27,*stepSize + (double)ptVar28,f);
                  v001 = (double)CONCAT44(extraout_XMM0_Db_03,extraout_XMM0_Da_03);
                  (*f->_vptr_function[2])
                            (SUB84(*stepSize + dVar30,0),dVar27,*stepSize + (double)ptVar28,f);
                  v101 = (double)CONCAT44(extraout_XMM0_Db_04,extraout_XMM0_Da_04);
                  dVar1 = *stepSize;
                  (*f->_vptr_function[2])
                            (SUB84(dVar1 + dVar30,0),dVar1 + dVar27,dVar1 + (double)ptVar28,f);
                  v111 = (double)CONCAT44(extraout_XMM0_Db_05,extraout_XMM0_Da_05);
                  (*f->_vptr_function[2])(uVar29,*stepSize + dVar27,*stepSize + (double)ptVar28,f);
                  v011 = (double)CONCAT44(extraout_XMM0_Db_06,extraout_XMM0_Da_06);
                  dVar1 = *isoValue;
                  uVar19 = (ulong)((uint)(v101 < dVar1) << 5 |
                                   (uint)(v001 < dVar1) << 4 | (uint)(uVar19 >> 4) |
                                   (uint)(v111 < dVar1) << 6 |
                                  (uint)((double)CONCAT44(extraout_XMM0_Db_06,extraout_XMM0_Da_06)
                                         <= dVar1 &&
                                        dVar1 != (double)CONCAT44(extraout_XMM0_Db_06,
                                                                  extraout_XMM0_Da_06)) << 7);
                  if (this->edges[uVar19] != 0) {
                    iVar6 = iVar12 + iVar23;
                    _local_180 = CONCAT44(uStack_17c,iVar6 * 3 + -1);
                    iVar16 = iVar23 + iVar14;
                    iVar18 = iVar23 + iVar15;
                    local_1a4 = iVar18 * 3 + -1;
                    uVar26 = 1;
                    piVar24 = vertexIndexList;
                    uVar25 = 0;
                    do {
                      if ((uVar26 & this->edges[uVar19]) != 0) {
                        switch(uVar25 & 0xffffffff) {
                        case 0:
                          *piVar24 = iVar18 * 3 + -3;
                          local_220 = 1.0;
                          local_228 = 1.0;
                          local_230 = 1.0;
                          local_218 = ptVar28;
                          local_210 = dVar27;
                          local_208 = dVar30;
                          vertex3::vertex3((vertex3 *)&x,&local_208,&local_210,(double *)&local_218,
                                           &local_220,&local_228,&local_230);
                          local_238 = *stepSize + dVar30;
                          local_250 = (pointer)0x3ff0000000000000;
                          local_258 = (pointer)0x3ff0000000000000;
                          local_260 = (pointer)0x3ff0000000000000;
                          local_248 = ptVar28;
                          local_240 = dVar27;
                          vertex3::vertex3((vertex3 *)&gv,&local_238,&local_240,(double *)&local_248
                                           ,(double *)&local_250,(double *)&local_258,
                                           (double *)&local_260);
                          cache_vertex(this,&vMap,piVar24,(vertex3 *)&x,(vertex3 *)&gv,&v000,&v100,
                                       isoValue,stepSize,local_200,false);
                          break;
                        case 1:
                          *piVar24 = iVar16 * 3 + -2;
                          local_208 = *stepSize + dVar30;
                          local_220 = 1.0;
                          local_228 = 1.0;
                          local_230 = 1.0;
                          local_218 = ptVar28;
                          local_210 = dVar27;
                          vertex3::vertex3((vertex3 *)&x,&local_208,&local_210,(double *)&local_218,
                                           &local_220,&local_228,&local_230);
                          local_238 = *stepSize + dVar30;
                          local_240 = *stepSize + dVar27;
                          local_250 = (pointer)0x3ff0000000000000;
                          local_258 = (pointer)0x3ff0000000000000;
                          local_260 = (pointer)0x3ff0000000000000;
                          local_248 = ptVar28;
                          vertex3::vertex3((vertex3 *)&gv,&local_238,&local_240,(double *)&local_248
                                           ,(double *)&local_250,(double *)&local_258,
                                           (double *)&local_260);
                          cache_vertex(this,&vMap,piVar24,(vertex3 *)&x,(vertex3 *)&gv,&v100,&v110,
                                       isoValue,stepSize,local_200,false);
                          break;
                        case 2:
                          *piVar24 = iVar6 * 3 + -3;
                          local_210 = *stepSize + dVar27;
                          local_220 = 1.0;
                          local_228 = 1.0;
                          local_230 = 1.0;
                          local_218 = ptVar28;
                          local_208 = dVar30;
                          vertex3::vertex3((vertex3 *)&x,&local_208,&local_210,(double *)&local_218,
                                           &local_220,&local_228,&local_230);
                          local_238 = *stepSize + dVar30;
                          local_240 = *stepSize + dVar27;
                          local_250 = (pointer)0x3ff0000000000000;
                          local_258 = (pointer)0x3ff0000000000000;
                          local_260 = (pointer)0x3ff0000000000000;
                          local_248 = ptVar28;
                          vertex3::vertex3((vertex3 *)&gv,&local_238,&local_240,(double *)&local_248
                                           ,(double *)&local_250,(double *)&local_258,
                                           (double *)&local_260);
                          cache_vertex(this,&vMap,piVar24,(vertex3 *)&x,(vertex3 *)&gv,&v010,&v110,
                                       isoValue,stepSize,local_200,false);
                          break;
                        case 3:
                          *piVar24 = iVar18 * 3 + -2;
                          local_220 = 1.0;
                          local_228 = 1.0;
                          local_230 = 1.0;
                          local_218 = ptVar28;
                          local_210 = dVar27;
                          local_208 = dVar30;
                          vertex3::vertex3((vertex3 *)&x,&local_208,&local_210,(double *)&local_218,
                                           &local_220,&local_228,&local_230);
                          local_240 = *stepSize + dVar27;
                          local_250 = (pointer)0x3ff0000000000000;
                          local_258 = (pointer)0x3ff0000000000000;
                          local_260 = (pointer)0x3ff0000000000000;
                          local_248 = ptVar28;
                          local_238 = dVar30;
                          vertex3::vertex3((vertex3 *)&gv,&local_238,&local_240,(double *)&local_248
                                           ,(double *)&local_250,(double *)&local_258,
                                           (double *)&local_260);
                          cache_vertex(this,&vMap,piVar24,(vertex3 *)&x,(vertex3 *)&gv,&v000,&v010,
                                       isoValue,stepSize,local_200,false);
                          break;
                        case 4:
                          *piVar24 = iVar18 * 3;
                          local_208 = *stepSize + dVar30;
                          local_218 = (pointer)(*stepSize + (double)ptVar28);
                          local_220 = 1.0;
                          local_228 = 1.0;
                          local_230 = 1.0;
                          local_210 = dVar27;
                          vertex3::vertex3((vertex3 *)&x,&local_208,&local_210,(double *)&local_218,
                                           &local_220,&local_228,&local_230);
                          local_248 = (pointer)(*stepSize + (double)ptVar28);
                          local_250 = (pointer)0x3ff0000000000000;
                          local_258 = (pointer)0x3ff0000000000000;
                          local_260 = (pointer)0x3ff0000000000000;
                          local_240 = dVar27;
                          local_238 = dVar30;
                          vertex3::vertex3((vertex3 *)&gv,&local_238,&local_240,(double *)&local_248
                                           ,(double *)&local_250,(double *)&local_258,
                                           (double *)&local_260);
                          cache_vertex(this,&vMap,piVar24,(vertex3 *)&x,(vertex3 *)&gv,&v101,&v001,
                                       isoValue,stepSize,local_200,false);
                          break;
                        case 5:
                          *piVar24 = iVar16 * 3 + 1;
                          local_208 = *stepSize + dVar30;
                          local_218 = (pointer)(*stepSize + (double)ptVar28);
                          local_220 = 1.0;
                          local_228 = 1.0;
                          local_230 = 1.0;
                          local_210 = dVar27;
                          vertex3::vertex3((vertex3 *)&x,&local_208,&local_210,(double *)&local_218,
                                           &local_220,&local_228,&local_230);
                          dVar1 = *stepSize;
                          local_238 = dVar1 + dVar30;
                          local_240 = dVar1 + dVar27;
                          local_248 = (pointer)(dVar1 + (double)ptVar28);
                          local_250 = (pointer)0x3ff0000000000000;
                          local_258 = (pointer)0x3ff0000000000000;
                          local_260 = (pointer)0x3ff0000000000000;
                          vertex3::vertex3((vertex3 *)&gv,&local_238,&local_240,(double *)&local_248
                                           ,(double *)&local_250,(double *)&local_258,
                                           (double *)&local_260);
                          cache_vertex(this,&vMap,piVar24,(vertex3 *)&x,(vertex3 *)&gv,&v101,&v111,
                                       isoValue,stepSize,local_200,false);
                          break;
                        case 6:
                          *piVar24 = iVar6 * 3;
                          dVar1 = *stepSize;
                          local_208 = dVar1 + dVar30;
                          local_210 = dVar1 + dVar27;
                          local_218 = (pointer)(dVar1 + (double)ptVar28);
                          local_220 = 1.0;
                          local_228 = 1.0;
                          local_230 = 1.0;
                          vertex3::vertex3((vertex3 *)&x,&local_208,&local_210,(double *)&local_218,
                                           &local_220,&local_228,&local_230);
                          local_240 = *stepSize + dVar27;
                          local_248 = (pointer)(*stepSize + (double)ptVar28);
                          local_250 = (pointer)0x3ff0000000000000;
                          local_258 = (pointer)0x3ff0000000000000;
                          local_260 = (pointer)0x3ff0000000000000;
                          local_238 = dVar30;
                          vertex3::vertex3((vertex3 *)&gv,&local_238,&local_240,(double *)&local_248
                                           ,(double *)&local_250,(double *)&local_258,
                                           (double *)&local_260);
                          cache_vertex(this,&vMap,piVar24,(vertex3 *)&x,(vertex3 *)&gv,&v111,&v011,
                                       isoValue,stepSize,local_200,false);
                          break;
                        case 7:
                          *piVar24 = iVar18 * 3 + 1;
                          local_218 = (pointer)(*stepSize + (double)ptVar28);
                          local_220 = 1.0;
                          local_228 = 1.0;
                          local_230 = 1.0;
                          local_210 = dVar27;
                          local_208 = dVar30;
                          vertex3::vertex3((vertex3 *)&x,&local_208,&local_210,(double *)&local_218,
                                           &local_220,&local_228,&local_230);
                          local_240 = *stepSize + dVar27;
                          local_248 = (pointer)(*stepSize + (double)ptVar28);
                          local_250 = (pointer)0x3ff0000000000000;
                          local_258 = (pointer)0x3ff0000000000000;
                          local_260 = (pointer)0x3ff0000000000000;
                          local_238 = dVar30;
                          vertex3::vertex3((vertex3 *)&gv,&local_238,&local_240,(double *)&local_248
                                           ,(double *)&local_250,(double *)&local_258,
                                           (double *)&local_260);
                          cache_vertex(this,&vMap,piVar24,(vertex3 *)&x,(vertex3 *)&gv,&v001,&v011,
                                       isoValue,stepSize,local_200,false);
                          break;
                        case 8:
                          *piVar24 = local_1a4;
                          local_220 = 1.0;
                          local_228 = 1.0;
                          local_230 = 1.0;
                          local_218 = ptVar28;
                          local_210 = dVar27;
                          local_208 = dVar30;
                          vertex3::vertex3((vertex3 *)&x,&local_208,&local_210,(double *)&local_218,
                                           &local_220,&local_228,&local_230);
                          local_248 = (pointer)(*stepSize + (double)ptVar28);
                          local_250 = (pointer)0x3ff0000000000000;
                          local_258 = (pointer)0x3ff0000000000000;
                          local_260 = (pointer)0x3ff0000000000000;
                          local_240 = dVar27;
                          local_238 = dVar30;
                          vertex3::vertex3((vertex3 *)&gv,&local_238,&local_240,(double *)&local_248
                                           ,(double *)&local_250,(double *)&local_258,
                                           (double *)&local_260);
                          cache_vertex(this,&vMap,piVar24,(vertex3 *)&x,(vertex3 *)&gv,&v000,&v001,
                                       isoValue,stepSize,local_200,false);
                          break;
                        case 9:
                          *piVar24 = iVar16 * 3 + -1;
                          local_208 = *stepSize + dVar30;
                          local_220 = 1.0;
                          local_228 = 1.0;
                          local_230 = 1.0;
                          local_218 = ptVar28;
                          local_210 = dVar27;
                          vertex3::vertex3((vertex3 *)&x,&local_208,&local_210,(double *)&local_218,
                                           &local_220,&local_228,&local_230);
                          local_238 = *stepSize + dVar30;
                          local_248 = (pointer)(*stepSize + (double)ptVar28);
                          local_250 = (pointer)0x3ff0000000000000;
                          local_258 = (pointer)0x3ff0000000000000;
                          local_260 = (pointer)0x3ff0000000000000;
                          local_240 = dVar27;
                          vertex3::vertex3((vertex3 *)&gv,&local_238,&local_240,(double *)&local_248
                                           ,(double *)&local_250,(double *)&local_258,
                                           (double *)&local_260);
                          cache_vertex(this,&vMap,piVar24,(vertex3 *)&x,(vertex3 *)&gv,&v100,&v101,
                                       isoValue,stepSize,local_200,false);
                          break;
                        case 10:
                          *piVar24 = (iVar23 + iVar13) * 3 + -1;
                          local_208 = *stepSize + dVar30;
                          local_210 = *stepSize + dVar27;
                          local_220 = 1.0;
                          local_228 = 1.0;
                          local_230 = 1.0;
                          local_218 = ptVar28;
                          vertex3::vertex3((vertex3 *)&x,&local_208,&local_210,(double *)&local_218,
                                           &local_220,&local_228,&local_230);
                          dVar1 = *stepSize;
                          local_238 = dVar1 + dVar30;
                          local_240 = dVar1 + dVar27;
                          local_248 = (pointer)(dVar1 + (double)ptVar28);
                          local_250 = (pointer)0x3ff0000000000000;
                          local_258 = (pointer)0x3ff0000000000000;
                          local_260 = (pointer)0x3ff0000000000000;
                          vertex3::vertex3((vertex3 *)&gv,&local_238,&local_240,(double *)&local_248
                                           ,(double *)&local_250,(double *)&local_258,
                                           (double *)&local_260);
                          cache_vertex(this,&vMap,piVar24,(vertex3 *)&x,(vertex3 *)&gv,&v110,&v111,
                                       isoValue,stepSize,local_200,false);
                          break;
                        case 0xb:
                          *piVar24 = local_180;
                          local_210 = *stepSize + dVar27;
                          local_220 = 1.0;
                          local_228 = 1.0;
                          local_230 = 1.0;
                          local_218 = ptVar28;
                          local_208 = dVar30;
                          vertex3::vertex3((vertex3 *)&x,&local_208,&local_210,(double *)&local_218,
                                           &local_220,&local_228,&local_230);
                          local_240 = *stepSize + dVar27;
                          local_248 = (pointer)(*stepSize + (double)ptVar28);
                          local_250 = (pointer)0x3ff0000000000000;
                          local_258 = (pointer)0x3ff0000000000000;
                          local_260 = (pointer)0x3ff0000000000000;
                          local_238 = dVar30;
                          vertex3::vertex3((vertex3 *)&gv,&local_238,&local_240,(double *)&local_248
                                           ,(double *)&local_250,(double *)&local_258,
                                           (double *)&local_260);
                          cache_vertex(this,&vMap,piVar24,(vertex3 *)&x,(vertex3 *)&gv,&v010,&v011,
                                       isoValue,stepSize,local_200,false);
                          break;
                        default:
                          goto switchD_001432dc_default;
                        }
                        free(local_1e8);
                        free(gv.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                             m_storage.m_data);
                        free(local_270);
                        free((void *)CONCAT44(x.
                                              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                              .m_storage.m_data._4_4_,
                                              (int)x.
                                                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                                  .m_storage.m_data));
                      }
switchD_001432dc_default:
                      uVar26 = uVar26 * 2;
                      uVar25 = uVar25 + 1;
                      piVar24 = piVar24 + 1;
                    } while (uVar25 != 0xc);
                    iVar6 = this->triangles[uVar19][0];
                    f = local_200;
                    if (iVar6 != -1) {
                      piVar24 = this->triangles[uVar19] + 1;
                      do {
                        if (flip_normal) {
                          x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                          .m_data._0_4_ = vertexIndexList[iVar6];
                          x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                          .m_data._4_4_ = vertexIndexList[*piVar24];
                          x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                          .m_rows._0_4_ = vertexIndexList[piVar24[1]];
                          std::
                          vector<std::tuple<int,int,int>,std::allocator<std::tuple<int,int,int>>>::
                          emplace_back<std::tuple<int,int,int>>
                                    ((vector<std::tuple<int,int,int>,std::allocator<std::tuple<int,int,int>>>
                                      *)&this->faces,(tuple<int,_int,_int> *)&x);
                        }
                        else {
                          x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                          .m_data._0_4_ = vertexIndexList[piVar24[1]];
                          x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                          .m_data._4_4_ = vertexIndexList[*piVar24];
                          x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                          .m_rows._0_4_ = vertexIndexList[iVar6];
                          std::
                          vector<std::tuple<int,int,int>,std::allocator<std::tuple<int,int,int>>>::
                          emplace_back<std::tuple<int,int,int>>
                                    ((vector<std::tuple<int,int,int>,std::allocator<std::tuple<int,int,int>>>
                                      *)&this->faces,(tuple<int,_int,_int> *)&x);
                        }
                        iVar6 = piVar24[2];
                        piVar24 = piVar24 + 3;
                        f = local_200;
                      } while (iVar6 != -1);
                    }
                  }
                  dVar2 = (double)ptVar28 + *stepSize;
                  iVar23 = iVar23 + 1;
                  v010 = v011;
                  v110 = v111;
                  v100 = v101;
                  v000 = v001;
                  if (boundary.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                      m_storage.m_rows < 3) goto LAB_00144baf;
                }
                dVar27 = *stepSize + dVar27;
                iVar7 = iVar7 + 1;
                if (boundary.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                    m_storage.m_rows < 2) goto LAB_00144baf;
              }
            } while (iVar21 != iVar10);
          }
          processFaces(this,&vMap,&this->faces);
          (*f->_vptr_function[8])(0,local_40,f,0,0);
          free(local_40[0]);
          v010 = (double)((ulong)v010 & 0xffffffff00000000);
          if ((this->plyfile).m_currentIndex != 0) {
            cVar20 = (dx != (function *)0x0 && dy != (function *)0x0) && dz != (function *)0x0;
            this_00 = &this->plyfile;
            local_1a4 = CONCAT31(local_1a4._1_3_,cVar20);
            do {
              ply_mesh::get_vertex_pos((ply_mesh *)&x,(uint *)this_00);
              gv.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
                   (double *)0x0;
              gv.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0
              ;
              free((void *)0x0);
              pdVar8 = (double *)malloc(0x18);
              if (((ulong)pdVar8 & 0xf) != 0) {
LAB_00144bde:
                __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                              ,"/usr/include/eigen3/Eigen/src/Core/util/Memory.h",0xb9,
                              "void *Eigen::internal::aligned_malloc(std::size_t)");
              }
              if (pdVar8 == (double *)0x0) {
                puVar9 = (undefined8 *)__cxa_allocate_exception(8);
                *puVar9 = operator_delete;
                __cxa_throw(puVar9,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
              }
              gv.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 3
              ;
              gv.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
                   pdVar8;
              if (cVar20 == '\0') {
                (*local_200->_vptr_function[9])(vertexIndexList,local_200,&x);
                uVar4 = vertexIndexList._8_8_;
                uVar3 = vertexIndexList._0_8_;
                if (gv.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                    m_rows != vertexIndexList._8_8_) {
                  if ((long)vertexIndexList._8_8_ < 0) {
                    __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                                  ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                                 );
                  }
                  free(gv.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                       m_data);
                  if (uVar4 == 0) {
                    pdVar8 = (double *)0x0;
                  }
                  else {
                    if ((ulong)uVar4 >> 0x3d != 0) {
LAB_00144d11:
                      puVar9 = (undefined8 *)__cxa_allocate_exception(8);
                      *puVar9 = operator_delete;
                      __cxa_throw(puVar9,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
                    }
                    pdVar8 = (double *)malloc(uVar4 * 8);
                    if (uVar4 != 1 && ((ulong)pdVar8 & 0xf) != 0) goto LAB_00144bde;
                    if (pdVar8 == (double *)0x0) goto LAB_00144d11;
                  }
                  uVar5 = vertexIndexList._8_8_;
                  vertexIndexList[2] = (int)uVar4;
                  vertexIndexList[3] = SUB84(uVar4,4);
                  gv.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                  ._0_4_ = vertexIndexList[2];
                  gv.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
                  ._4_4_ = vertexIndexList[3];
                  gv.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                       = pdVar8;
                  vertexIndexList._8_8_ = uVar5;
                }
                if (gv.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                    m_rows != uVar4) {
                  __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                                "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,
                                "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, 1>, T1 = double, T2 = double]"
                               );
                }
                uVar19 = gv.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                         .m_rows - (gv.
                                    super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                                    m_storage.m_rows >> 0x3f) & 0xfffffffffffffffe;
                if (1 < gv.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                        m_rows) {
                  lVar22 = 0;
                  do {
                    pdVar8 = (double *)(uVar3 + lVar22 * 8);
                    dVar27 = pdVar8[1];
                    gv.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                    m_data[lVar22] = *pdVar8;
                    (gv.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                     m_data + lVar22)[1] = dVar27;
                    lVar22 = lVar22 + 2;
                  } while (lVar22 < (long)uVar19);
                }
                if ((long)uVar19 <
                    gv.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                    m_rows) {
                  do {
                    gv.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                    m_data[uVar19] = *(double *)(uVar3 + uVar19 * 8);
                    uVar19 = uVar19 + 1;
                  } while (gv.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                           m_storage.m_rows != uVar19);
                }
                free((void *)vertexIndexList._0_8_);
                cVar20 = (char)local_1a4;
              }
              else {
                (*dx->_vptr_function[3])(dx,&x);
                vertexIndexList._0_8_ = &gv;
                vertexIndexList[2] = 0;
                vertexIndexList[3] = 0;
                vertexIndexList[4] = 1;
                vertexIndexList[5] = 0;
                vertexIndexList[6] = 1;
                vertexIndexList[7] = 0;
                if (gv.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                    m_rows < 1) {
                  vertexIndexList._0_8_ = &gv;
                  vertexIndexList[6] = 1;
                  vertexIndexList[7] = 0;
                  vertexIndexList[4] = 1;
                  vertexIndexList[5] = 0;
                  vertexIndexList[2] = 0;
                  vertexIndexList[3] = 0;
                  __assert_fail("m_xpr.rows() > 0 && m_xpr.cols() > 0 && \"Cannot comma-initialize a 0x0 matrix (operator<<)\""
                                ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x25,
                                "Eigen::CommaInitializer<Eigen::Matrix<double, -1, 1>>::CommaInitializer(XprType &, const Scalar &) [MatrixType = Eigen::Matrix<double, -1, 1>]"
                               );
                }
                *gv.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                     = (double)CONCAT44(extraout_XMM0_Db_07,extraout_XMM0_Da_07);
                (*dy->_vptr_function[3])(dy,&x);
                v000 = (double)CONCAT44(extraout_XMM0_Db_08,extraout_XMM0_Da_08);
                this_01 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::
                          operator_((CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                                    vertexIndexList,&v000);
                (*dz->_vptr_function[3])(dz,&x);
                v001 = (double)CONCAT44(extraout_XMM0_Db_09,extraout_XMM0_Da_09);
                Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                          (this_01,&v001);
                if ((vertexIndexList._24_8_ + vertexIndexList._8_8_ !=
                     *(long *)(vertexIndexList._0_8_ + 8)) || (vertexIndexList._16_8_ != 1)) {
                  __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                                ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,
                                "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, -1, 1>>::finished() [MatrixType = Eigen::Matrix<double, -1, 1>]"
                               );
                }
              }
              if (flip_normal) {
                v000 = (double)&gv;
                Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
                PlainObjectBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                          ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)vertexIndexList,
                           (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            *)&v000);
                ply_mesh::set_normal(this_00,(uint *)&v010,(vector *)vertexIndexList);
                free((void *)vertexIndexList._0_8_);
              }
              else {
                ply_mesh::set_normal(this_00,(uint *)&v010,&gv);
              }
              free(gv.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                   m_data);
              free((void *)CONCAT44(x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                    .m_storage.m_data._4_4_,
                                    (int)x.
                                         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                                         .m_storage.m_data));
              uVar11 = v010._0_4_ + 1;
              v010 = (double)CONCAT44(v010._4_4_,uVar11);
            } while (uVar11 < (uint)this_00->m_currentIndex);
          }
          std::
          _Rb_tree<int,_std::pair<const_int,_sisl::vertex3>,_std::_Select1st<std::pair<const_int,_sisl::vertex3>_>,_std::less<int>,_std::allocator<std::pair<const_int,_sisl::vertex3>_>_>
          ::~_Rb_tree(&vMap._M_t);
          free(boundary.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data);
          return;
        }
      }
    }
  }
LAB_00144baf:
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x19a,
                "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator[](Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
               );
}

Assistant:

void march_function(
            function *f,
            const double &isoValue,
            const double &stepSize,
            sisl::vector origin,
            sisl::vector extent,
            bool flip_normal = false,
            sisl::function *dx = nullptr,
            sisl::function *dy = nullptr,
            sisl::function *dz = nullptr){

        // Namespaces
        using namespace std;
        using namespace sisl;

        if(extent[0] < 0 || extent[1] < 0 || extent[2] < 0) throw "Invalid extent for marching cubes!";

        sisl::vector boundary = origin + extent;
        // Figure out the steps in each direction
        int xres = (int)floor((extent[0])/stepSize);
        int yres = (int)floor((extent[1])/stepSize);
        int zres = (int)floor((extent[2])/stepSize);
        int res = xres*2;

        map<int, sisl::vertex3 > vMap;

        #pragma omp parallel for
        for(int i = 0; i < xres; i++) {
            float x = origin[0] + i * stepSize;
            int j = 0;

            double     v000 = 0, v001 = 0, v010 = 0, v100 = 0,
                    v011 = 0, v110 = 0, v101 = 0, v111 = 0;
            // Break up the inner loops over
            for(float y = origin[1]; y < boundary[1]; y+=stepSize,j++) {
                int idx = 0;
                int k = 0;

                // Eval these only once
                v000 = (*f)(x,                y,            origin[2]);
                v100 = (*f)(x+stepSize,     y,             origin[2]);
                v110 = (*f)(x+stepSize,     y+stepSize,    origin[2]);
                v010 = (*f)(x,                y+stepSize,    origin[2]);

                idx |=    (v000 < isoValue) ? 16 : 0;     // {0,0,0}, 0001000
                idx |=    (v100 < isoValue) ? 32 : 0;     // {1,0,0}, 0010000
                idx |=    (v110 < isoValue) ? 64 : 0;     // {1,1,0}, 0100000
                idx |=    (v010 < isoValue) ? 128 : 0;     // {0,1,0}, 1000000

                for(float z = origin[2]; z < boundary[2]; z+=stepSize, k++) {
                    v001 = (*f)(x,                y,             z+stepSize);
                    v101 = (*f)(x+stepSize,        y,             z+stepSize);
                    v111 = (*f)(x+stepSize,        y+stepSize,    z+stepSize);
                    v011 = (*f)(x,                y+stepSize,    z+stepSize);

                    idx >>= 4;
                    idx |= (v001 < isoValue) ? 16 : 0 ;  // {0,0,1}
                    idx |= (v101 < isoValue) ? 32 : 0 ;  // {1,0,1}
                    idx |= (v111 < isoValue) ? 64 : 0 ;  // {1,1,1}
                    idx |= (v011 < isoValue) ? 128 : 0 ; // {0,1,1}

                    // Cube is entirely in/out of the surface
                    if (!edges[idx]){
                        v000 = v001;
                        v100 = v101;
                        v110 = v111;
                        v010 = v011;
                        continue;
                    }

                    // Find the vertices where the surface intersects the cube
                    int edgeBit = 1;
                    int vertexIndexList[12];

                    #define MAP_INDEX(x,y,z) (( (((x+i)*res) + (y+j))*res)+(z+k)-1)
                    #define ss stepSize
                    for(int c = 0; c < 12; c++) {
                        if(edges[idx] & edgeBit){
                            switch(c){
                                case 0:
                                    vertexIndexList[c] = MAP_INDEX(0,0,0) * 3;//vIndex*3;
                                    cache_vertex(&vMap,vertexIndexList[c],
                                        vertex3(x,y,z,1,1,1),
                                        vertex3(x+ss,y,z,1,1,1),
                                        v000,v100,isoValue,ss,f);
                                    break;

                                case 2:
                                    vertexIndexList[c] = MAP_INDEX(0,1,0) * 3; //(vIndex+zres)*3;
                                    cache_vertex(&vMap,vertexIndexList[c],
                                        vertex3(x,y+ss,z,1,1,1),
                                        vertex3(x+ss,y+ss,z,1,1,1),
                                        v010,v110,isoValue,ss,f);
                                    break;
                                case 4:
                                    vertexIndexList[c] = MAP_INDEX(0,0,1) * 3; //(vIndex+1)*3;
                                    cache_vertex(&vMap,vertexIndexList[c],
                                        vertex3(x+ss,y,z+ss,1,1,1),
                                        vertex3(x,y,z+ss,1,1,1),
                                        v101,v001,isoValue,ss,f);
                                    break;
                                case 6:
                                    vertexIndexList[c] = MAP_INDEX(0,1,1) * 3; //(vIndex+yres+1)*3;
                                    cache_vertex(&vMap,vertexIndexList[c],
                                        vertex3(x+ss,y+ss,z+ss,1,1,1),
                                        vertex3(x,y+ss,z+ss,1,1,1),
                                        v111,v011,isoValue,ss,f);
                                    break;
                                /////////////

                                case 1:
                                    vertexIndexList[c] = MAP_INDEX(1,0,0) * 3 + 1;//(vIndex+yres*zres)*3+1;
                                    cache_vertex(&vMap,vertexIndexList[c],
                                        vertex3(x+ss,y,z,1,1,1),
                                        vertex3(x+ss,y+ss,z,1,1,1),
                                        v100,v110,isoValue,ss,f);
                                    break;

                                case 3:
                                    vertexIndexList[c] = MAP_INDEX(0,0,0) * 3 + 1;//vIndex*3+1;
                                    cache_vertex(&vMap,vertexIndexList[c],
                                        vertex3(x,y,z,1,1,1),
                                        vertex3(x,y+ss,z,1,1,1),
                                        v000,v010,isoValue,ss,f);
                                    break; // 0, 0, 0

                                case 5:
                                    vertexIndexList[c] = MAP_INDEX(1,0,1) * 3 + 1;//(vIndex+yres*zres+1)*3+1;
                                    cache_vertex(&vMap,vertexIndexList[c],
                                        vertex3(x+ss,y,z+ss,1,1,1),
                                        vertex3(x+ss,y+ss,z+ss,1,1,1),
                                        v101,v111,isoValue,ss,f);
                                    break; // 1, 0, 1
                                case 7:
                                    vertexIndexList[c] = MAP_INDEX(0,0,1) * 3 + 1;//(vIndex+1)*3+1;
                                    cache_vertex(&vMap,vertexIndexList[c],
                                        vertex3(x,y,z+ss,1,1,1),
                                        vertex3(x,y+ss,z+ss,1,1,1),
                                        v001,v011,isoValue,ss,f);
                                    break; //0,0,1

                                //////////////////////////////

                                case 8:
                                    vertexIndexList[c] = MAP_INDEX(0,0,0) * 3 + 2;//vIndex*3+2;
                                    cache_vertex(&vMap,vertexIndexList[c],
                                        vertex3(x,y,z,1,1,1),
                                        vertex3(x,y,z+ss,1,1,1),
                                        v000,v001,isoValue,ss,f);
                                    break; //0,0,0
                                case 9:
                                    vertexIndexList[c] = MAP_INDEX(1,0,0) * 3 + 2;//(vIndex+yres*zres)*3+2;
                                    cache_vertex(&vMap,vertexIndexList[c],
                                        vertex3(x+ss,y,z,1,1,1),
                                        vertex3(x+ss,y,z+ss,1,1,1),
                                        v100,v101,isoValue,ss,f);
                                    break; //1,0,0
                                case 10:
                                    vertexIndexList[c] = MAP_INDEX(1,1,0) * 3 + 2;//(vIndex+yres*zres+zres)*3+2;
                                    cache_vertex(&vMap,vertexIndexList[c],
                                        vertex3(x+ss,y+ss,z,1,1,1),
                                        vertex3(x+ss,y+ss,z+ss,1,1,1),
                                        v110,v111,isoValue,ss,f);
                                    break; //1,1,0
                                case 11:
                                    vertexIndexList[c] = MAP_INDEX(0,1,0) * 3 + 2;//(vIndex+yres)*3+2;
                                    cache_vertex(&vMap,vertexIndexList[c],
                                        vertex3(x,y+ss,z,1,1,1),
                                        vertex3(x,y+ss,z+ss,1,1,1),
                                        v010,v011,isoValue,ss,f);
                                    break; //0,1,0
                            }
                        }
                        edgeBit<<=1;
                    }

                    #undef ss
                    #undef MAP_INDEX

                    // Create the triangles
                    for(int c = 0; triangles[idx][c] != -1;){

                        #pragma omp critical (add_face2)
                        {
                            if(flip_normal) {
                                faces.push_back(tuple<int,int,int>(
                                    vertexIndexList[triangles[idx][c+2]],
                                    vertexIndexList[triangles[idx][c+1]],
                                    vertexIndexList[triangles[idx][c]]));

                            }else {
                                faces.push_back(tuple<int,int,int>(
                                    vertexIndexList[triangles[idx][c]],
                                    vertexIndexList[triangles[idx][c+1]],
                                    vertexIndexList[triangles[idx][c+2]]));
                            }
                            c += 3;
                        }
                    }

                    // Setup for next cube
                    v000 = v001;
                    v100 = v101;
                    v110 = v111;
                    v010 = v011;
                }
            }
        }
        processFaces(&vMap, faces);

        // Now that we know where all the vertices should lie, 
        // let's figure out the normal directions
        bool use_grad = false;
        try {
            f->grad(0,0,0);
            use_grad = true;
        } catch(const char *e) { }
        bool use_d_func = !(dx == nullptr || dy == nullptr || dz == nullptr); 

        for(unsigned int i = 0; i < plyfile.count_vertices(); i++) {
            vector x = plyfile.get_vertex_pos(i);
            vector gv(3);

            if(use_d_func) {
                gv << (*dx)(x), (*dy)(x), (*dz)(x);
            }else if(use_grad) {
                gv = f->grad(x);
            }else {
                double h = m_shadingSs;
                double ddx = ((*f)(x[0]+h, x[1]  , x[2]  ) - (*f)(x[0]-h, x[1]  , x[2]  ))/(2*h);
                double ddy = ((*f)(x[0],   x[1]+h, x[2]  ) - (*f)(x[0]  , x[1]-h, x[2]  ))/(2*h);
                double ddz = ((*f)(x[0],   x[1]  , x[2]+h) - (*f)(x[0]  , x[1]  , x[2]-h))/(2*h);
                gv << ddx, ddy, ddz;
            }
            if(flip_normal)
                plyfile.set_normal(i, -gv);
            else
                plyfile.set_normal(i, gv);
        }

    }